

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O0

LogContext * log_init(LogPolicy *lp,Conf *conf)

{
  int iVar1;
  LogContext *pLVar2;
  Conf *pCVar3;
  LogContext *ctx;
  Conf *conf_local;
  LogPolicy *lp_local;
  
  pLVar2 = (LogContext *)safemalloc(1,0x58,0);
  pLVar2->lgfp = (FILE *)0x0;
  pLVar2->state = L_CLOSED;
  pLVar2->lp = lp;
  pCVar3 = conf_copy(conf);
  pLVar2->conf = pCVar3;
  iVar1 = conf_get_int(pLVar2->conf,0x82);
  pLVar2->logtype = iVar1;
  pLVar2->currlogfilename = (Filename *)0x0;
  bufchain_init(&pLVar2->queue);
  return pLVar2;
}

Assistant:

LogContext *log_init(LogPolicy *lp, Conf *conf)
{
    LogContext *ctx = snew(LogContext);
    ctx->lgfp = NULL;
    ctx->state = L_CLOSED;
    ctx->lp = lp;
    ctx->conf = conf_copy(conf);
    ctx->logtype = conf_get_int(ctx->conf, CONF_logtype);
    ctx->currlogfilename = NULL;
    bufchain_init(&ctx->queue);
    return ctx;
}